

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O1

void __thiscall cmStateSnapshot::SetDefaultDefinitions(cmStateSnapshot *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  char cVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  PointerType pSVar8;
  PointerType pcVar9;
  char *__s;
  size_t sVar10;
  PointerType pBVar11;
  uint uVar12;
  PositionType *this_00;
  size_type __rlen;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string_view value_06;
  string_view value_07;
  string_view value_08;
  string_view value_09;
  string_view sVar13;
  string __str;
  string local_70;
  long *local_50;
  uint local_48;
  undefined4 uStack_44;
  long local_40 [2];
  
  sVar13 = cmSystemTools::GetSystemName();
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_HOST_SYSTEM_NAME","");
  this_00 = &this->Position;
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  cmDefinitions::Set(pcVar9,&local_70,sVar13);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (sVar13._M_len == 7) {
    iVar6 = bcmp(sVar13._M_str,"Windows",7);
    if (iVar6 == 0) {
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"WIN32","");
      pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
      pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
      sVar13._M_str = "1";
      sVar13._M_len = 1;
      cmDefinitions::Set(pcVar9,&local_70,sVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != paVar1) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      local_70._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_HOST_WIN32","");
      pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
      pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
      value_03._M_str = "1";
      value_03._M_len = 1;
      cmDefinitions::Set(pcVar9,&local_70,value_03);
      goto LAB_0026d41d;
    }
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"UNIX","");
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  value._M_str = "1";
  value._M_len = 1;
  cmDefinitions::Set(pcVar9,&local_70,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_HOST_UNIX","");
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  value_00._M_str = "1";
  value_00._M_len = 1;
  cmDefinitions::Set(pcVar9,&local_70,value_00);
LAB_0026d41d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"LINUX","");
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  value_01._M_str = "1";
  value_01._M_len = 1;
  cmDefinitions::Set(pcVar9,&local_70,value_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_HOST_LINUX","");
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  value_02._M_str = "1";
  value_02._M_len = 1;
  cmDefinitions::Set(pcVar9,&local_70,value_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_MAJOR_VERSION","");
  uVar7 = cmVersion::GetMajorVersion();
  cVar5 = '\x01';
  if (9 < uVar7) {
    uVar12 = uVar7;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar12 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_0026d621;
      }
      if (uVar12 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_0026d621;
      }
      if (uVar12 < 10000) goto LAB_0026d621;
      bVar2 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar2);
    cVar5 = cVar5 + '\x01';
  }
LAB_0026d621:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_50,local_48,uVar7);
  plVar3 = local_50;
  value_04._M_len._4_4_ = uStack_44;
  value_04._M_len._0_4_ = local_48;
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  value_04._M_str = (char *)plVar3;
  cmDefinitions::Set(pcVar9,&local_70,value_04);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_MINOR_VERSION","");
  uVar7 = cmVersion::GetMinorVersion();
  cVar5 = '\x01';
  if (9 < uVar7) {
    uVar12 = uVar7;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar12 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_0026d717;
      }
      if (uVar12 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_0026d717;
      }
      if (uVar12 < 10000) goto LAB_0026d717;
      bVar2 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar2);
    cVar5 = cVar5 + '\x01';
  }
LAB_0026d717:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_50,local_48,uVar7);
  plVar3 = local_50;
  value_05._M_len._4_4_ = uStack_44;
  value_05._M_len._0_4_ = local_48;
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  value_05._M_str = (char *)plVar3;
  cmDefinitions::Set(pcVar9,&local_70,value_05);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_PATCH_VERSION","");
  uVar7 = cmVersion::GetPatchVersion();
  cVar5 = '\x01';
  if (9 < uVar7) {
    uVar12 = uVar7;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar12 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_0026d807;
      }
      if (uVar12 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_0026d807;
      }
      if (uVar12 < 10000) goto LAB_0026d807;
      bVar2 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar2);
    cVar5 = cVar5 + '\x01';
  }
LAB_0026d807:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_50,local_48,uVar7);
  plVar3 = local_50;
  value_06._M_len._4_4_ = uStack_44;
  value_06._M_len._0_4_ = local_48;
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  value_06._M_str = (char *)plVar3;
  cmDefinitions::Set(pcVar9,&local_70,value_06);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_TWEAK_VERSION","");
  uVar7 = cmVersion::GetTweakVersion();
  cVar5 = '\x01';
  if (9 < uVar7) {
    uVar12 = uVar7;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar12 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_0026d8f7;
      }
      if (uVar12 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_0026d8f7;
      }
      if (uVar12 < 10000) goto LAB_0026d8f7;
      bVar2 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar2);
    cVar5 = cVar5 + '\x01';
  }
LAB_0026d8f7:
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_50,local_48,uVar7);
  plVar3 = local_50;
  value_07._M_len._4_4_ = uStack_44;
  value_07._M_len._0_4_ = local_48;
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  value_07._M_str = (char *)plVar3;
  cmDefinitions::Set(pcVar9,&local_70,value_07);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_VERSION","");
  __s = cmVersion::GetCMakeVersion();
  sVar10 = strlen(__s);
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  value_08._M_str = __s;
  value_08._M_len = sVar10;
  cmDefinitions::Set(pcVar9,&local_70,value_08);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CMAKE_FILES_DIRECTORY","");
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pcVar9 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar8->Vars);
  value_09._M_str = "/CMakeFiles";
  value_09._M_len = 0xb;
  cmDefinitions::Set(pcVar9,&local_70,value_09);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pBVar11 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                      (&pSVar8->BuildSystemDirectory);
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"INCLUDE_REGULAR_EXPRESSION","");
  cmPropertyMap::SetProperty(&pBVar11->Properties,&local_70,"^.*$");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmStateSnapshot::SetDefaultDefinitions()
{
  /* Up to CMake 2.4 here only WIN32, UNIX and APPLE were set.
    With CMake must separate between target and host platform. In most cases
    the tests for WIN32, UNIX and APPLE will be for the target system, so an
    additional set of variables for the host system is required ->
    CMAKE_HOST_WIN32, CMAKE_HOST_UNIX, CMAKE_HOST_APPLE.
    WIN32, UNIX and APPLE are now set in the platform files in
    Modules/Platforms/.
    To keep cmake scripts (-P) and custom language and compiler modules
    working, these variables are still also set here in this place, but they
    will be reset in CMakeSystemSpecificInformation.cmake before the platform
    files are executed. */
  cm::string_view hostSystemName = cmSystemTools::GetSystemName();
  this->SetDefinition("CMAKE_HOST_SYSTEM_NAME", hostSystemName);
  if (hostSystemName == "Windows") {
    this->SetDefinition("WIN32", "1");
    this->SetDefinition("CMAKE_HOST_WIN32", "1");
  } else {
    this->SetDefinition("UNIX", "1");
    this->SetDefinition("CMAKE_HOST_UNIX", "1");
  }
#if defined(__CYGWIN__)
  std::string legacy;
  if (cmSystemTools::GetEnv("CMAKE_LEGACY_CYGWIN_WIN32", legacy) &&
      cmIsOn(legacy)) {
    this->SetDefinition("WIN32", "1");
    this->SetDefinition("CMAKE_HOST_WIN32", "1");
  }
#endif
#if defined(__APPLE__)
  this->SetDefinition("APPLE", "1");
  this->SetDefinition("CMAKE_HOST_APPLE", "1");
#endif
#if defined(__sun__)
  this->SetDefinition("CMAKE_HOST_SOLARIS", "1");
#endif

#if defined(__OpenBSD__)
  this->SetDefinition("BSD", "OpenBSD");
  this->SetDefinition("CMAKE_HOST_BSD", "OpenBSD");
#elif defined(__FreeBSD__)
  this->SetDefinition("BSD", "FreeBSD");
  this->SetDefinition("CMAKE_HOST_BSD", "FreeBSD");
#elif defined(__NetBSD__)
  this->SetDefinition("BSD", "NetBSD");
  this->SetDefinition("CMAKE_HOST_BSD", "NetBSD");
#elif defined(__DragonFly__)
  this->SetDefinition("BSD", "DragonFlyBSD");
  this->SetDefinition("CMAKE_HOST_BSD", "DragonFlyBSD");
#endif

#if defined(__linux__)
  this->SetDefinition("LINUX", "1");
  this->SetDefinition("CMAKE_HOST_LINUX", "1");
#endif

  this->SetDefinition("CMAKE_MAJOR_VERSION",
                      std::to_string(cmVersion::GetMajorVersion()));
  this->SetDefinition("CMAKE_MINOR_VERSION",
                      std::to_string(cmVersion::GetMinorVersion()));
  this->SetDefinition("CMAKE_PATCH_VERSION",
                      std::to_string(cmVersion::GetPatchVersion()));
  this->SetDefinition("CMAKE_TWEAK_VERSION",
                      std::to_string(cmVersion::GetTweakVersion()));
  this->SetDefinition("CMAKE_VERSION", cmVersion::GetCMakeVersion());

  this->SetDefinition("CMAKE_FILES_DIRECTORY", "/CMakeFiles");

  // Setup the default include file regular expression (match everything).
  this->Position->BuildSystemDirectory->Properties.SetProperty(
    "INCLUDE_REGULAR_EXPRESSION", "^.*$");
}